

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumented_benchmark.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  undefined7 uVar4;
  uint uVar5;
  bool verbose;
  char *pcVar6;
  bool tabular;
  ulong uVar7;
  long lVar8;
  allocator local_7d;
  undefined4 local_7c;
  ulong local_78;
  longlong local_70;
  ulong local_68;
  uint local_5c;
  string local_58;
  ulong local_38;
  
  local_78 = 100000;
  local_70 = 1;
  local_38 = 0;
  local_5c = 0;
  uVar7 = 0;
  do {
    iVar3 = getopt(argc,argv,"vhtm:n:i:");
    uVar4 = (undefined7)
            ((ulong)((long)&switchD_0011abd1::switchdataD_00120400 +
                    (long)(int)(&switchD_0011abd1::switchdataD_00120400)[iVar3 - 0x68]) >> 8);
    switch(iVar3) {
    case 0x68:
      printf(" Try %s -n 100000 -i 15 -v \n",*argv);
      puts("-n is the number of 16-bit words ");
      puts("-i is the number of tests or iterations ");
      pcVar6 = "-v makes things verbose";
LAB_0011b347:
      puts(pcVar6);
      return 0;
    case 0x69:
      iVar3 = atoi(_optarg);
      uVar7 = (ulong)iVar3;
      break;
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x73:
    case 0x75:
switchD_0011abd1_caseD_6a:
      abort();
    case 0x6d:
      local_70 = atoll(_optarg);
      break;
    case 0x6e:
      local_78 = atoll(_optarg);
      break;
    case 0x74:
      local_38 = CONCAT71(uVar4,1);
      break;
    case 0x76:
      local_5c = (uint)CONCAT71(uVar4,1);
      break;
    default:
      if (iVar3 != -1) goto switchD_0011abd1_caseD_6a;
      if (local_78 >> 0x20 != 0) {
        printf("setting n to %u \n",0xffffffffffffffff);
        local_78 = 0xffffffff;
      }
      uVar1 = local_38;
      uVar5 = local_5c;
      if (uVar7 >> 0x20 != 0) {
        printf("setting iterations to %u \n",0xffffffffffffffff);
        uVar7 = 0xffffffff;
      }
      local_68 = 10;
      if (local_78 * local_70 < 1000000) {
        local_68 = 100;
      }
      if (uVar7 != 0) {
        local_68 = uVar7;
      }
      if (local_78 == 0) {
        puts("n cannot be zero.");
        return 1;
      }
      if ((uVar1 & 1) == 0) {
        if ((uVar5 & 1) == 0) {
          local_7c = 1;
          uVar5 = 0;
        }
        else {
          local_7c = 0;
          printf("%-40s\t","memcpy-8");
          uVar5 = (uint)CONCAT71((uint7)(uint3)(uVar5 >> 8),1);
        }
      }
      else {
        iVar3 = puts(
                    "Method\tSz\tIt\tI/c\tC/w\tI/w\tCycles\tInstructions\tBMiss\tCRef\tCMiss\tTime\tMBs"
                    );
        local_7c = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
      }
      std::__cxx11::string::string((string *)&local_58,"memcpy-8",&local_7d);
      verbose = (bool)((byte)uVar5 & 1);
      tabular = (bool)((byte)uVar1 & 1);
      benchmarkMemoryCopy(&local_58,(uint32_t)local_78,(uint32_t)local_70,(uint32_t)local_68,verbose
                          ,tabular);
      std::__cxx11::string::~string((string *)&local_58);
      if ((char)local_7c == '\0') {
        printf("%-40s\t","memcpy-16");
      }
      std::__cxx11::string::string((string *)&local_58,"memcpy-16",&local_7d);
      local_5c = uVar5;
      benchmarkMemoryCopy(&local_58,(int)local_78 * 2,(uint32_t)local_70,(uint32_t)local_68,verbose,
                          tabular);
      std::__cxx11::string::~string((string *)&local_58);
      for (lVar8 = 0; lVar8 != 0x38; lVar8 = lVar8 + 8) {
        if ((char)local_7c == '\0') {
          printf("%-40s\t",*(undefined8 *)((long)pospopcnt_u16_method_names + lVar8));
        }
        fflush((FILE *)0x0);
        pcVar6 = *(char **)((long)pospopcnt_u16_method_names + lVar8);
        std::__cxx11::string::string((string *)&local_58,pcVar6,&local_7d);
        bVar2 = benchmarkMany(&local_58,(uint32_t)local_78,(uint32_t)local_70,(uint32_t)local_68,
                              *(pospopcnt_u16_method_type *)((long)pospopcnt_u16_methods + lVar8),
                              verbose,true,tabular);
        std::__cxx11::string::~string((string *)&local_58);
        if (!bVar2) {
          printf("Problem detected with %s.\n",pcVar6);
        }
      }
      for (lVar8 = 0; lVar8 != 0x38; lVar8 = lVar8 + 8) {
        if ((char)local_7c == '\0') {
          printf("%-40s\t",*(undefined8 *)((long)pospopcnt_u16_method_names + lVar8 + 0x38));
        }
        fflush((FILE *)0x0);
        pcVar6 = *(char **)((long)pospopcnt_u16_method_names + lVar8 + 0x38);
        std::__cxx11::string::string((string *)&local_58,pcVar6,&local_7d);
        bVar2 = benchmarkMany(&local_58,(uint32_t)local_78,(uint32_t)local_70,(uint32_t)local_68,
                              *(pospopcnt_u16_method_type *)
                               ((long)pospopcnt_u16_sse_methods + lVar8),verbose,true,tabular);
        std::__cxx11::string::~string((string *)&local_58);
        if (!bVar2) {
          printf("Problem detected with %s.\n",pcVar6);
        }
      }
      for (lVar8 = 0; lVar8 != 0x60; lVar8 = lVar8 + 8) {
        if ((char)local_7c == '\0') {
          printf("%-40s\t",*(undefined8 *)((long)pospopcnt_u16_method_names + lVar8 + 0x70));
        }
        fflush((FILE *)0x0);
        pcVar6 = *(char **)((long)pospopcnt_u16_method_names + lVar8 + 0x70);
        std::__cxx11::string::string((string *)&local_58,pcVar6,&local_7d);
        bVar2 = benchmarkMany(&local_58,(uint32_t)local_78,(uint32_t)local_70,(uint32_t)local_68,
                              *(pospopcnt_u16_method_type *)
                               ((long)pospopcnt_u16_avx2_methods + lVar8),verbose,true,tabular);
        std::__cxx11::string::~string((string *)&local_58);
        if (!bVar2) {
          printf("Problem detected with %s.\n",pcVar6);
        }
      }
      for (lVar8 = 0; lVar8 != 0x60; lVar8 = lVar8 + 8) {
        if ((char)local_7c == '\0') {
          printf("%-40s\t",*(undefined8 *)((long)pospopcnt_u16_method_names + lVar8 + 0xd0));
        }
        fflush((FILE *)0x0);
        pcVar6 = *(char **)((long)pospopcnt_u16_method_names + lVar8 + 0xd0);
        std::__cxx11::string::string((string *)&local_58,pcVar6,&local_7d);
        bVar2 = benchmarkMany(&local_58,(uint32_t)local_78,(uint32_t)local_70,(uint32_t)local_68,
                              *(pospopcnt_u16_method_type *)
                               ((long)pospopcnt_u16_avx512_methods + lVar8),verbose,true,tabular);
        std::__cxx11::string::~string((string *)&local_58);
        if (!bVar2) {
          printf("Problem detected with %s.\n",pcVar6);
        }
      }
      for (lVar8 = 0; lVar8 != 0x30; lVar8 = lVar8 + 8) {
        if ((char)local_7c == '\0') {
          printf("%-40s\t",*(undefined8 *)((long)pospopcnt_u8_method_names + lVar8 + 8));
        }
        fflush((FILE *)0x0);
        pcVar6 = *(char **)((long)pospopcnt_u8_method_names + lVar8 + 8);
        std::__cxx11::string::string((string *)&local_58,pcVar6,&local_7d);
        bVar2 = benchmarkMany8(&local_58,(uint32_t)local_78,(uint32_t)local_70,(uint32_t)local_68,
                               *(pospopcnt_u8_method_type *)((long)pospopcnt_u8_methods + lVar8),
                               verbose,true,tabular);
        std::__cxx11::string::~string((string *)&local_58);
        if (!bVar2) {
          printf("Problem detected with %s.\n",pcVar6);
        }
      }
      for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 8) {
        if ((char)local_7c == '\0') {
          printf("%-40s\t",*(undefined8 *)((long)pospopcnt_u8_method_names + lVar8 + 0x38));
        }
        fflush((FILE *)0x0);
        pcVar6 = *(char **)((long)pospopcnt_u8_method_names + lVar8 + 0x38);
        std::__cxx11::string::string((string *)&local_58,pcVar6,&local_7d);
        bVar2 = benchmarkMany8(&local_58,(uint32_t)local_78,(uint32_t)local_70,(uint32_t)local_68,
                               *(pospopcnt_u8_method_type *)((long)pospopcnt_u8_sse_methods + lVar8)
                               ,verbose,true,tabular);
        std::__cxx11::string::~string((string *)&local_58);
        if (!bVar2) {
          printf("Problem detected with %s.\n",pcVar6);
        }
      }
      for (lVar8 = 0; lVar8 != 0x68; lVar8 = lVar8 + 8) {
        if ((char)local_7c == '\0') {
          printf("%-40s\t",*(undefined8 *)((long)pospopcnt_u8_method_names + lVar8 + 0x78));
        }
        fflush((FILE *)0x0);
        pcVar6 = *(char **)((long)pospopcnt_u8_method_names + lVar8 + 0x78);
        std::__cxx11::string::string((string *)&local_58,pcVar6,&local_7d);
        bVar2 = benchmarkMany8(&local_58,(uint32_t)local_78,(uint32_t)local_70,(uint32_t)local_68,
                               *(pospopcnt_u8_method_type *)
                                ((long)pospopcnt_u8_avx2_methods + lVar8),verbose,true,tabular);
        std::__cxx11::string::~string((string *)&local_58);
        if (!bVar2) {
          printf("Problem detected with %s.\n",pcVar6);
        }
      }
      for (lVar8 = 0; lVar8 != 0x68; lVar8 = lVar8 + 8) {
        if ((char)local_7c == '\0') {
          printf("%-40s\t",*(undefined8 *)((long)pospopcnt_u8_method_names + lVar8 + 0xe0));
        }
        fflush((FILE *)0x0);
        pcVar6 = *(char **)((long)pospopcnt_u8_method_names + lVar8 + 0xe0);
        std::__cxx11::string::string((string *)&local_58,pcVar6,&local_7d);
        bVar2 = benchmarkMany8(&local_58,(uint32_t)local_78,(uint32_t)local_70,(uint32_t)local_68,
                               *(pospopcnt_u8_method_type *)
                                ((long)pospopcnt_u8_avx512_methods + lVar8),verbose,true,tabular);
        std::__cxx11::string::~string((string *)&local_58);
        if (!bVar2) {
          printf("Problem detected with %s.\n",pcVar6);
        }
      }
      if ((local_5c & 1) != 0) {
        return 0;
      }
      pcVar6 = "Try -v to get more details.";
      goto LAB_0011b347;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv) {
    size_t n = 100000;
    size_t m = 1;
    size_t iterations = 0; 
    bool verbose = false;
    bool tabular = false;
    int c;

    while ((c = getopt(argc, argv, "vhtm:n:i:")) != -1) {
        switch (c) {
        case 'n':
            n = atoll(optarg);
            break;
        case 'm':
            m = atoll(optarg);
            break;
        case 'v':
            verbose = true;
            break;
        case 't':
            tabular = true;
            break;
        case 'h':
            print_usage(argv[0]);
            return EXIT_SUCCESS;
        case 'i':
            iterations = atoi(optarg);
            break;
        default:
            abort();
        }
    }

    if(n > UINT32_MAX) {
       printf("setting n to %u \n", UINT32_MAX);
       n = UINT32_MAX;
    }

    if(iterations > UINT32_MAX) {
       printf("setting iterations to %u \n", UINT32_MAX);
       iterations = UINT32_MAX;
    }

    if(iterations == 0) {
      if(m*n < 1000000) iterations = 100;
      else iterations = 10;
    }
    // printf("n = %zu m = %zu \n", n, m);
    // printf("iterations = %zu \n", iterations);
    if(n == 0) {
       printf("n cannot be zero.\n");
       return EXIT_FAILURE;
    }

    size_t array_in_bytes = sizeof(uint16_t) * n * m;
    // if(array_in_bytes < 1024) {
    //   printf("array size: %zu B\n", array_in_bytes);
    // } else if (array_in_bytes < 1024 * 1024) {
    //   printf("array size: %.3f kB\n", array_in_bytes / 1024.);
    // } else {
    //   printf("array size: %.3f MB\n", array_in_bytes / (1024 * 1024.));
    // }

// #if POSPOPCNT_SIMD_VERSION >= 5
//     measurepopcnt(n*m, iterations, verbose);
// #endif
//     measureoverhead(n*m, iterations, verbose);
    
    if (tabular)
        printf("Method\tSz\tIt\tI/c\tC/w\tI/w\tCycles\tInstructions\tBMiss\tCRef\tCMiss\tTime\tMBs\n");

    if (verbose && !tabular) printf("%-40s\t", "memcpy-8");
    benchmarkMemoryCopy("memcpy-8", n, m, iterations, verbose, tabular);
    if (verbose && !tabular) printf("%-40s\t", "memcpy-16");
    benchmarkMemoryCopy("memcpy-16", 2*n, m, iterations, verbose, tabular);

    for (size_t k = 0; k < 7; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u16_method_names[k]);
        fflush(NULL);
        bool isok = benchmarkMany(pospopcnt_u16_method_names[k], n, m, iterations, pospopcnt_u16_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u16_method_names[k]);
        }
        // if (verbose) printf("\n");
    }
#if POSPOPCNT_SIMD_VERSION >= 3
    for (size_t k = 0; k < 7; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u16_method_names[7+k]);
        fflush(NULL);
        bool isok = benchmarkMany(pospopcnt_u16_method_names[7+k], n, m, iterations, pospopcnt_u16_sse_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u16_method_names[7+k]);
        }
        // if (verbose) printf("\n");
    }
#endif

#if POSPOPCNT_SIMD_VERSION >= 5
    for (size_t k = 0; k < 12; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u16_method_names[14+k]);
        fflush(NULL);
        bool isok = benchmarkMany(pospopcnt_u16_method_names[14+k], n, m, iterations, pospopcnt_u16_avx2_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u16_method_names[14+k]);
        }
        // if (verbose) printf("\n");
    }
#endif

#if POSPOPCNT_SIMD_VERSION >= 6
    for (size_t k = 0; k < 12; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u16_method_names[26+k]);
        fflush(NULL);
        bool isok = benchmarkMany(pospopcnt_u16_method_names[26+k], n, m, iterations, pospopcnt_u16_avx512_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u16_method_names[26+k]);
        }
        // if (verbose) printf("\n");
    }
#endif

    for (size_t k = 0; k < 6; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u8_method_names[k+1]);
        fflush(NULL);
        bool isok = benchmarkMany8(pospopcnt_u8_method_names[k+1], n, m, iterations, pospopcnt_u8_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u8_method_names[k+1]);
        }
        // if (verbose) printf("\n");
    }

#if POSPOPCNT_SIMD_VERSION >= 3
    for (size_t k = 0; k < 8; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u8_method_names[k+1+6]);
        fflush(NULL);
        bool isok = benchmarkMany8(pospopcnt_u8_method_names[k+1+6], n, m, iterations, pospopcnt_u8_sse_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u8_method_names[k+1+6]);
        }
        // if (verbose) printf("\n");
    }
#endif

#if POSPOPCNT_SIMD_VERSION >= 5
    for (size_t k = 0; k < 13; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u8_method_names[k+1+6+8]);
        fflush(NULL);
        bool isok = benchmarkMany8(pospopcnt_u8_method_names[k+1+6+8], n, m, iterations, pospopcnt_u8_avx2_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u8_method_names[k+1+6+8]);
        }
        // if (verbose) printf("\n");
    }
#endif

#if POSPOPCNT_SIMD_VERSION >= 6
    for (size_t k = 0; k < 13; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u8_method_names[k+1+6+8+13]);
        fflush(NULL);
        bool isok = benchmarkMany8(pospopcnt_u8_method_names[k+1+6+8+13], n, m, iterations, pospopcnt_u8_avx512_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u8_method_names[k+1+6+8+13]);
        }
        // if (verbose) printf("\n");
    }
#endif

    if (!verbose)
        printf("Try -v to get more details.\n");

    return EXIT_SUCCESS;
}